

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

bool __thiscall QMainWindowTabBar::event(QMainWindowTabBar *this,QEvent *e)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  Shape SVar5;
  ulong uVar6;
  int iVar7;
  
  if (*(short *)(e + 8) != 0x6e) goto LAB_0043beee;
  lVar3 = *(long *)(this + 0x20);
  iVar1 = *(int *)(lVar3 + 0x14);
  iVar2 = *(int *)(lVar3 + 0x1c);
  iVar7 = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
  uVar6 = (**(code **)(*(long *)this + 0x70))(this);
  SVar5 = QTabBar::shape((QTabBar *)this);
  if (SVar5 == RoundedWest) {
LAB_0043bed8:
    uVar6 = uVar6 >> 0x20;
  }
  else {
    SVar5 = QTabBar::shape((QTabBar *)this);
    if (SVar5 == RoundedEast) goto LAB_0043bed8;
    iVar7 = iVar2 - iVar1;
  }
  if ((int)uVar6 <= iVar7 + 1) {
    e[0xc] = (QEvent)0x1;
    return true;
  }
LAB_0043beee:
  bVar4 = QTabBar::event((QTabBar *)this,e);
  return bVar4;
}

Assistant:

bool QMainWindowTabBar::event(QEvent *e)
{
    // show the tooltip if tab is too small to fit label

    if (e->type() != QEvent::ToolTip)
        return QTabBar::event(e);
    QSize size = this->size();
    QSize hint = sizeHint();
    if (shape() == QTabBar::RoundedWest || shape() == QTabBar::RoundedEast) {
        size = size.transposed();
        hint = hint.transposed();
    }
    if (size.width() < hint.width())
        return QTabBar::event(e);
    e->accept();
    return true;
}